

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::Array<char>_> *
kj::parse::Times_<const_kj::parse::Any__&>::Impl<kj::parse::IteratorInput<char,_const_char_*>,_char>
::apply(Maybe<kj::Array<char>_> *__return_storage_ptr__,Any_ *subParser,uint count,
       IteratorInput<char,_const_char_*> *input)

{
  bool bVar1;
  size_t sVar2;
  NullableValue<char> *other;
  char *pcVar3;
  char *pcVar4;
  Array<char> local_78;
  Maybe<char> local_5c;
  NullableValue<char> local_5a;
  uint local_58;
  NullableValue<char> subResult;
  undefined1 local_48 [8];
  ArrayBuilder<char> results;
  IteratorInput<char,_const_char_*> *input_local;
  uint count_local;
  Any_ *subParser_local;
  
  results.disposer = (ArrayDisposer *)input;
  heapArrayBuilder<char>((ArrayBuilder<char> *)local_48,(ulong)count);
  while( true ) {
    sVar2 = ArrayBuilder<char>::size((ArrayBuilder<char> *)local_48);
    if (count <= sVar2) {
      ArrayBuilder<char>::finish(&local_78,(ArrayBuilder<char> *)local_48);
      Maybe<kj::Array<char>_>::Maybe(__return_storage_ptr__,&local_78);
      Array<char>::~Array(&local_78);
      local_58 = 1;
      goto LAB_003f3ce3;
    }
    bVar1 = IteratorInput<char,_const_char_*>::atEnd
                      ((IteratorInput<char,_const_char_*> *)results.disposer);
    if (bVar1) break;
    Any_::operator()((Any_ *)&local_5c,(IteratorInput<char,_const_char_*> *)subParser);
    other = kj::_::readMaybe<char>(&local_5c);
    kj::_::NullableValue<char>::NullableValue(&local_5a,other);
    Maybe<char>::~Maybe(&local_5c);
    pcVar3 = kj::_::NullableValue::operator_cast_to_char_((NullableValue *)&local_5a);
    if (pcVar3 == (char *)0x0) {
      Maybe<kj::Array<char>_>::Maybe(__return_storage_ptr__,(void *)0x0);
    }
    else {
      pcVar4 = kj::_::NullableValue<char>::operator*(&local_5a);
      pcVar4 = mv<char>(pcVar4);
      ArrayBuilder<char>::add<char>((ArrayBuilder<char> *)local_48,pcVar4);
    }
    local_58 = (uint)(pcVar3 == (char *)0x0);
    kj::_::NullableValue<char>::~NullableValue(&local_5a);
    if (local_58 != 0) {
LAB_003f3ce3:
      ArrayBuilder<char>::~ArrayBuilder((ArrayBuilder<char> *)local_48);
      return __return_storage_ptr__;
    }
  }
  Maybe<kj::Array<char>_>::Maybe(__return_storage_ptr__,(void *)0x0);
  local_58 = 1;
  goto LAB_003f3ce3;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, uint count, Input& input) {
    auto results = heapArrayBuilder<OutputType<SubParser, Input>>(count);

    while (results.size() < count) {
      if (input.atEnd()) {
        return nullptr;
      } else KJ_IF_MAYBE(subResult, subParser(input)) {
        results.add(kj::mv(*subResult));
      } else {
        return nullptr;
      }
    }

    return results.finish();
  }